

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,floating_type f,
          floating_format_info *fmt,source_location *param_3)

{
  uint *puVar1;
  size_type sVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_07;
  string *this_00;
  string s;
  undefined1 local_2a0 [40];
  detail local_278 [32];
  detail local_258 [32];
  detail local_238 [32];
  detail local_218 [32];
  string local_1f8 [32];
  detail local_1d8 [32];
  detail local_1b8 [32];
  ostringstream oss;
  long local_190 [2];
  uint auStack_180 [88];
  
  this_00 = &s;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  set_locale((serializer<toml::type_config> *)local_2a0,(ostream *)this);
  std::locale::~locale((locale *)local_2a0);
  if (NAN(f)) {
    if ((long)f < 0) {
      std::operator<<((ostream *)&oss,'-');
    }
    std::operator<<((ostream *)&oss,"nan");
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      std::operator<<((ostream *)&oss,'_');
      std::operator<<((ostream *)&oss,(string *)&fmt->suffix);
    }
    std::__cxx11::stringbuf::str();
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (__return_storage_ptr__,local_1b8,s_07);
    this_00 = (string *)local_1b8;
  }
  else if (ABS(f) == INFINITY) {
    if ((long)f < 0) {
      std::operator<<((ostream *)&oss,'-');
    }
    std::operator<<((ostream *)&oss,"inf");
    if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
      std::operator<<((ostream *)&oss,'_');
      std::operator<<((ostream *)&oss,(string *)&fmt->suffix);
    }
    std::__cxx11::stringbuf::str();
    string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
              (__return_storage_ptr__,local_1d8,s_00);
    this_00 = (string *)local_1d8;
  }
  else {
    switch(fmt->fmt) {
    case defaultfloat:
      if (fmt->prec != 0) {
        *(long *)((long)local_190 + *(long *)(_oss + -0x18)) = (long)(int)fmt->prec;
      }
      std::ostream::_M_insert<double>(f);
      std::__cxx11::stringbuf::str();
      sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,'.',0);
      if (((sVar2 == 0xffffffffffffffff) &&
          (sVar2 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &s,'e',0), sVar2 == 0xffffffffffffffff)) &&
         (sVar2 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s
                             ,'E',0), sVar2 == 0xffffffffffffffff)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,".0");
      }
      if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,'_');
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fmt->suffix
                  );
      }
      std::__cxx11::string::string
                (local_1f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s);
      string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                (__return_storage_ptr__,(detail *)local_1f8,s_01);
      std::__cxx11::string::~string(local_1f8);
      break;
    case fixed:
      if (fmt->prec != 0) {
        *(long *)((long)local_190 + *(long *)(_oss + -0x18)) = (long)(int)fmt->prec;
      }
      *(uint *)((long)auStack_180 + *(long *)(_oss + -0x18)) =
           *(uint *)((long)auStack_180 + *(long *)(_oss + -0x18)) & 0xfffffefb | 4;
      std::ostream::_M_insert<double>(f);
      if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
        poVar3 = std::operator<<((ostream *)&oss,'_');
        std::operator<<(poVar3,(string *)&fmt->suffix);
      }
      std::__cxx11::stringbuf::str();
      string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                (__return_storage_ptr__,local_218,s_04);
      this_00 = (string *)local_218;
      break;
    case scientific:
      if (fmt->prec != 0) {
        *(long *)((long)local_190 + *(long *)(_oss + -0x18)) = (long)(int)fmt->prec;
      }
      *(uint *)((long)auStack_180 + *(long *)(_oss + -0x18)) =
           *(uint *)((long)auStack_180 + *(long *)(_oss + -0x18)) & 0xfffffefb | 0x100;
      std::ostream::_M_insert<double>(f);
      if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
        poVar3 = std::operator<<((ostream *)&oss,'_');
        std::operator<<(poVar3,(string *)&fmt->suffix);
      }
      std::__cxx11::stringbuf::str();
      string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                (__return_storage_ptr__,local_238,s_02);
      this_00 = (string *)local_238;
      break;
    case hex:
      if ((this->spec_).ext_hex_float == true) {
        puVar1 = (uint *)((long)auStack_180 + *(long *)(_oss + -0x18));
        *puVar1 = *puVar1 | 0x104;
        std::ostream::_M_insert<double>(f);
        std::__cxx11::stringbuf::str();
        string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                  (__return_storage_ptr__,local_258,s_03);
        this_00 = (string *)local_258;
      }
      else {
        *(undefined8 *)((long)local_190 + *(long *)(_oss + -0x18)) = 0x11;
        *(uint *)((long)auStack_180 + *(long *)(_oss + -0x18)) =
             *(uint *)((long)auStack_180 + *(long *)(_oss + -0x18)) & 0xfffffefb | 0x100;
        std::ostream::_M_insert<double>(f);
        std::__cxx11::stringbuf::str();
        string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                  (__return_storage_ptr__,local_278,s_06);
        this_00 = (string *)local_278;
      }
      break;
    default:
      if (((this->spec_).ext_num_suffix == true) && ((fmt->suffix)._M_string_length != 0)) {
        poVar3 = std::operator<<((ostream *)&oss,'_');
        std::operator<<(poVar3,(string *)&fmt->suffix);
      }
      std::__cxx11::stringbuf::str();
      string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
                (__return_storage_ptr__,(detail *)(local_2a0 + 8),s_05);
      this_00 = (string *)(local_2a0 + 8);
    }
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const floating_type f, const floating_format_info& fmt, const source_location&) // {{{
    {
        using std::isnan;
        using std::isinf;
        using std::signbit;

        std::ostringstream oss;
        this->set_locale(oss);

        if(isnan(f))
        {
            if(signbit(f))
            {
                oss << '-';
            }
            oss << "nan";
            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                oss << '_';
                oss << fmt.suffix;
            }
            return string_conv<string_type>(oss.str());
        }

        if(isinf(f))
        {
            if(signbit(f))
            {
                oss << '-';
            }
            oss << "inf";
            if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
            {
                oss << '_';
                oss << fmt.suffix;
            }
            return string_conv<string_type>(oss.str());
        }

        switch(fmt.fmt)
        {
            case floating_format::defaultfloat:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << f;
                // since defaultfloat may omit point, we need to add it
                std::string s = oss.str();
                if (s.find('.') == std::string::npos &&
                    s.find('e') == std::string::npos &&
                    s.find('E') == std::string::npos )
                {
                    s += ".0";
                }
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    s += '_';
                    s += fmt.suffix;
                }
                return string_conv<string_type>(s);
            }
            case floating_format::fixed:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << std::fixed << f;
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
            case floating_format::scientific:
            {
                if(fmt.prec != 0)
                {
                    oss << std::setprecision(static_cast<int>(fmt.prec));
                }
                oss << std::scientific << f;
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
            case floating_format::hex:
            {
                if(this->spec_.ext_hex_float)
                {
                    oss << std::hexfloat << f;
                    // suffix is only for decimal numbers.
                    return string_conv<string_type>(oss.str());
                }
                else // no hex allowed. output with max precision.
                {
                    oss << std::setprecision(std::numeric_limits<floating_type>::max_digits10)
                        << std::scientific << f;
                    // suffix is only for decimal numbers.
                    return string_conv<string_type>(oss.str());
                }
            }
            default:
            {
                if(this->spec_.ext_num_suffix && ! fmt.suffix.empty())
                {
                    oss << '_' << fmt.suffix;
                }
                return string_conv<string_type>(oss.str());
            }
        }
    }